

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void primary_expr(Vm *vm)

{
  int iVar1;
  _Bool _Var2;
  _Bool local_59;
  Token local_58;
  Token local_38;
  long local_18;
  size_t num_args;
  Vm *vm_local;
  
  num_args = (size_t)vm;
  primary(vm);
  while( true ) {
    _Var2 = check((Vm *)num_args,TOKEN_OPEN_PAREN);
    local_59 = true;
    if (!_Var2) {
      _Var2 = check((Vm *)num_args,TOKEN_OPEN_BRACKET);
      local_59 = true;
      if (!_Var2) {
        local_59 = check((Vm *)num_args,TOKEN_DOT);
      }
    }
    if (local_59 == false) break;
    iVar1 = *(int *)(num_args + 0x1020);
    if (iVar1 == 0) {
      while (_Var2 = match((Vm *)num_args,TOKEN_OPEN_PAREN), _Var2) {
        local_18 = 0;
        _Var2 = match((Vm *)num_args,TOKEN_CLOSE_PAREN);
        if (_Var2) {
          emit_byte_arg((Vm *)num_args,OP_CALL,'\0');
        }
        else {
          do {
            expr((Vm *)num_args);
            local_18 = local_18 + 1;
            _Var2 = match((Vm *)num_args,TOKEN_COMMA);
          } while (_Var2);
          consume(&local_38,(Vm *)num_args,TOKEN_CLOSE_PAREN,"Expected \')\' after argument list");
          emit_byte_arg((Vm *)num_args,OP_CALL,(uint8_t)local_18);
        }
      }
    }
    else if (iVar1 == 0x29) {
      while (_Var2 = match((Vm *)num_args,TOKEN_DOT), _Var2) {
        _Var2 = check((Vm *)num_args,TOKEN_IDENTIFIER);
        if (!_Var2) {
          error((Compiler *)(num_args + 0x1020),"Expected identifier after \'.\'");
        }
        string((Vm *)num_args,false);
        advance((Vm *)num_args);
        handle_struct_assign((Vm *)num_args);
      }
    }
    else if (iVar1 == 0x2a) {
      while (_Var2 = match((Vm *)num_args,TOKEN_OPEN_BRACKET), _Var2) {
        expr((Vm *)num_args);
        consume(&local_58,(Vm *)num_args,TOKEN_CLOSE_BRACKET,"Expected \']\' after expression");
        handle_struct_assign((Vm *)num_args);
      }
    }
  }
  return;
}

Assistant:

static void primary_expr(Vm *vm) {
    primary(vm);

    while (check(vm, TOKEN_OPEN_PAREN) || check(vm, TOKEN_OPEN_BRACKET) || check(vm, TOKEN_DOT)) {
        switch (vm->compiler.token.type) {
            case TOKEN_OPEN_PAREN: {
                // Call
                while (match(vm, TOKEN_OPEN_PAREN)) {
                    size_t num_args = 0;
                    if (!match(vm, TOKEN_CLOSE_PAREN)) {
                        do {
                            expr(vm);
                            ++num_args;
                        } while (match(vm, TOKEN_COMMA));

                        consume(vm, TOKEN_CLOSE_PAREN, "Expected ')' after argument list");
                        emit_byte_arg(vm, OP_CALL, (uint8_t) num_args);
                    } else {
                        emit_byte_arg(vm, OP_CALL, 0);
                    }
                }
                break;
            }
            case TOKEN_DOT: {
                while (match(vm, TOKEN_DOT)) {
                    if (!check(vm, TOKEN_IDENTIFIER)) {
                        error(&vm->compiler, "Expected identifier after '.'");
                    }

                    string(vm, false);
                    advance(vm);

                    handle_struct_assign(vm);
                }
                break;
            }
            case TOKEN_OPEN_BRACKET: {
                while (match(vm, TOKEN_OPEN_BRACKET)) {
                    expr(vm);
                    consume(vm, TOKEN_CLOSE_BRACKET, "Expected ']' after expression");

                    handle_struct_assign(vm);
                }
                break;
            }
            default:
                break;
        }
    }
}